

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O0

void zhash_vmap_values(zhash_t *zh,_func_void_varargs *f)

{
  int iVar1;
  void *p;
  void *value;
  void *key;
  zhash_iterator_t itr;
  _func_void_varargs *f_local;
  zhash_t *zh_local;
  
  itr._16_8_ = f;
  if (zh == (zhash_t *)0x0) {
    __assert_fail("zh != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                  ,0x194,"void zhash_vmap_values(zhash_t *, void (*)())");
  }
  if (f != (_func_void_varargs *)0x0) {
    zhash_iterator_init(zh,(zhash_iterator_t *)&key);
    while (iVar1 = zhash_iterator_next_volatile((zhash_iterator_t *)&key,&value,&p), iVar1 != 0) {
      (*(code *)itr._16_8_)(*p);
    }
  }
  return;
}

Assistant:

void zhash_vmap_values(zhash_t * zh, void (*f)())
{
    assert(zh != NULL);
    if (f == NULL)
        return;

    zhash_iterator_t itr;
    zhash_iterator_init(zh, &itr);

    void *key, *value;
    while(zhash_iterator_next_volatile(&itr, &key, &value)) {
        void *p = *(void**) value;
        f(p);
    }
}